

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QPersistentModelIndex>::QList(QList<QPersistentModelIndex> *this,qsizetype size)

{
  QArrayDataPointer<QPersistentModelIndex> *in_RSI;
  QArrayDataPointer<QPersistentModelIndex> *in_RDI;
  QArrayDataPointer<QPersistentModelIndex> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  AllocationOption in_stack_ffffffffffffffec;
  
  QArrayDataPointer<QPersistentModelIndex>::QArrayDataPointer
            (unaff_retaddr,(qsizetype)in_RDI,(qsizetype)in_RSI,in_stack_ffffffffffffffec);
  if (in_RSI != (QArrayDataPointer<QPersistentModelIndex> *)0x0) {
    QArrayDataPointer<QPersistentModelIndex>::operator->(in_RDI);
    QArrayDataPointer<QPersistentModelIndex>::appendInitialize
              (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }